

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.h
# Opt level: O1

void read_nal_unit_header_svc_extension(nal_svc_ext_t *nal_svc_ext,bs_t *b)

{
  byte *pbVar1;
  int iVar2;
  uint32_t r;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  _Bool _Var7;
  bool bVar8;
  
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar5 = b->p;
  pbVar1 = b->end;
  if (pbVar5 < pbVar1) {
    _Var7 = (*pbVar5 >> (uVar3 & 0x1f) & 1) != 0;
  }
  else {
    _Var7 = false;
  }
  if (uVar3 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  nal_svc_ext->idr_flag = _Var7;
  uVar3 = b->bits_left;
  pbVar5 = b->p;
  uVar4 = 0;
  iVar2 = 5;
  do {
    uVar3 = uVar3 - 1;
    b->bits_left = uVar3;
    uVar6 = 0;
    if (pbVar5 < pbVar1) {
      uVar6 = (uint)((*pbVar5 >> (uVar3 & 0x1f) & 1) != 0);
    }
    if (uVar3 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar3 = 8;
    }
    uVar4 = uVar4 | uVar6 << ((byte)iVar2 & 0x1f);
    bVar8 = iVar2 != 0;
    iVar2 = iVar2 + -1;
  } while (bVar8);
  nal_svc_ext->priority_id = (uchar)uVar4;
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar5 = b->p;
  if (pbVar5 < pbVar1) {
    _Var7 = (*pbVar5 >> (uVar3 & 0x1f) & 1) != 0;
  }
  else {
    _Var7 = false;
  }
  if (uVar3 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  nal_svc_ext->no_inter_layer_pred_flag = _Var7;
  uVar3 = b->bits_left;
  pbVar5 = b->p;
  uVar4 = 0;
  iVar2 = 2;
  do {
    uVar3 = uVar3 - 1;
    b->bits_left = uVar3;
    uVar6 = 0;
    if (pbVar5 < pbVar1) {
      uVar6 = (uint)((*pbVar5 >> (uVar3 & 0x1f) & 1) != 0);
    }
    if (uVar3 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar3 = 8;
    }
    uVar4 = uVar4 | uVar6 << ((byte)iVar2 & 0x1f);
    bVar8 = iVar2 != 0;
    iVar2 = iVar2 + -1;
  } while (bVar8);
  nal_svc_ext->dependency_id = (uchar)uVar4;
  uVar3 = b->bits_left;
  pbVar5 = b->p;
  uVar4 = 0;
  iVar2 = 3;
  do {
    uVar3 = uVar3 - 1;
    b->bits_left = uVar3;
    uVar6 = 0;
    if (pbVar5 < pbVar1) {
      uVar6 = (uint)((*pbVar5 >> (uVar3 & 0x1f) & 1) != 0);
    }
    if (uVar3 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar3 = 8;
    }
    uVar4 = uVar4 | uVar6 << ((byte)iVar2 & 0x1f);
    bVar8 = iVar2 != 0;
    iVar2 = iVar2 + -1;
  } while (bVar8);
  nal_svc_ext->quality_id = (uchar)uVar4;
  uVar3 = b->bits_left;
  pbVar5 = b->p;
  uVar4 = 0;
  iVar2 = 2;
  do {
    uVar3 = uVar3 - 1;
    b->bits_left = uVar3;
    uVar6 = 0;
    if (pbVar5 < pbVar1) {
      uVar6 = (uint)((*pbVar5 >> (uVar3 & 0x1f) & 1) != 0);
    }
    if (uVar3 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar3 = 8;
    }
    uVar4 = uVar4 | uVar6 << ((byte)iVar2 & 0x1f);
    bVar8 = iVar2 != 0;
    iVar2 = iVar2 + -1;
  } while (bVar8);
  nal_svc_ext->temporal_id = (uchar)uVar4;
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar5 = b->p;
  if (pbVar5 < pbVar1) {
    _Var7 = (*pbVar5 >> (uVar3 & 0x1f) & 1) != 0;
  }
  else {
    _Var7 = false;
  }
  if (uVar3 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  nal_svc_ext->use_ref_base_pic_flag = _Var7;
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar5 = b->p;
  if (pbVar5 < pbVar1) {
    _Var7 = (*pbVar5 >> (uVar3 & 0x1f) & 1) != 0;
  }
  else {
    _Var7 = false;
  }
  if (uVar3 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  nal_svc_ext->discardable_flag = _Var7;
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar5 = b->p;
  if (pbVar5 < pbVar1) {
    _Var7 = (*pbVar5 >> (uVar3 & 0x1f) & 1) != 0;
  }
  else {
    _Var7 = false;
  }
  if (uVar3 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  nal_svc_ext->output_flag = _Var7;
  uVar3 = b->bits_left;
  pbVar5 = b->p;
  uVar4 = 0;
  iVar2 = 1;
  do {
    uVar3 = uVar3 - 1;
    b->bits_left = uVar3;
    uVar6 = 0;
    if (pbVar5 < pbVar1) {
      uVar6 = (uint)((*pbVar5 >> (uVar3 & 0x1f) & 1) != 0);
    }
    if (uVar3 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar3 = 8;
    }
    uVar4 = uVar4 | uVar6 << ((byte)iVar2 & 0x1f);
    bVar8 = iVar2 != 0;
    iVar2 = iVar2 + -1;
  } while (bVar8);
  nal_svc_ext->reserved_three_2bits = (uchar)uVar4;
  return;
}

Assistant:

static inline uint32_t bs_read_u1(bs_t* b)
{
    uint32_t r = 0;
    
    b->bits_left--;

    if (! bs_eof(b))
    {
        r = ((*(b->p)) >> b->bits_left) & 0x01;
    }

    if (b->bits_left == 0) { b->p ++; b->bits_left = 8; }

    return r;
}